

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_ui.cpp
# Opt level: O1

bool InitError(bilingual_str *str)

{
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  boost::signals2::
  signal<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int),_boost::signals2::optional_last_value<bool>,_int,_std::less<int>,_boost::function<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>,_boost::function<bool_(const_boost::signals2::connection_&,_const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>,_boost::signals2::mutex>
  ::operator()(&g_ui_signals.ThreadSafeMessageBox,str,&local_40,0x10000402);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool InitError(const bilingual_str& str)
{
    uiInterface.ThreadSafeMessageBox(str, "", CClientUIInterface::MSG_ERROR);
    return false;
}